

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q8dot.cpp
# Opt level: O0

void __thiscall Stat::reportResult(Stat *this,char *title)

{
  undefined8 in_RSI;
  double *in_RDI;
  double dVar1;
  double dt;
  double t;
  double local_20;
  
  if (*(int *)(in_RDI + 4) < 1) {
    printf("%s(%s): no result\n","reportResult",in_RSI);
  }
  else {
    printf("============ %s\n",in_RSI);
    printf("<dot> = %g\n",*in_RDI / (double)*(int *)(in_RDI + 4));
    dVar1 = in_RDI[1] / (double)*(int *)(in_RDI + 4);
    local_20 = -dVar1 * dVar1 + in_RDI[2] / (double)*(int *)(in_RDI + 4);
    if (0.0 < local_20) {
      local_20 = sqrt(local_20);
    }
    printf("<time> = %g +/- %g us. Max. time = %g us.\n",dVar1,local_20,in_RDI[3]);
  }
  return;
}

Assistant:

void reportResult(const char* title) const {
        if (nloop < 1) {
            printf("%s(%s): no result\n",__func__,title);
            return;
        }
        printf("============ %s\n",title);
        printf("<dot> = %g\n",sum/nloop);
        auto t = sumt/nloop, dt = sumt2/nloop - t*t;
        if (dt > 0) dt = sqrt(dt);
        printf("<time> = %g +/- %g us. Max. time = %g us.\n",t,dt,maxt);
    }